

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackFrame.SystemV.cpp
# Opt level: O0

bool __thiscall Js::Amd64StackFrame::SkipToFrame(Amd64StackFrame *this,void *frameAddress)

{
  bool bVar1;
  void *frameAddress_local;
  Amd64StackFrame *this_local;
  
  this->frame = (void **)frameAddress;
  bVar1 = Next(this);
  return bVar1;
}

Assistant:

bool
Amd64StackFrame::SkipToFrame(void * frameAddress)
{
    this->frame = (void **)frameAddress;
    return Next();
}